

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeTanks(ProjectWriter *this)

{
  undefined1 *puVar1;
  double dVar2;
  pointer ppNVar3;
  Node *pNVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ostream *poVar8;
  Tank *tank;
  pointer ppNVar9;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[TANKS]\n",9);
  ppNVar3 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar3; ppNVar9 = ppNVar9 + 1) {
    pNVar4 = *ppNVar9;
    iVar7 = (*(pNVar4->super_Element)._vptr_Element[2])(pNVar4);
    if (iVar7 == 1) {
      lVar5 = *(long *)&this->field_0x18;
      dVar2 = (this->network->units).factors[1];
      lVar6 = *(long *)(lVar5 + -0x18);
      *(uint *)(&this->field_0x30 + lVar6) =
           *(uint *)(&this->field_0x30 + lVar6) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0x10;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(pNVar4->super_Element).name._M_dataplus._M_p,
                          (pNVar4->super_Element).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      lVar5 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar5 + -0x18)) = 0xc;
      *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar5 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar5 + -0x18)) = 4;
      std::ostream::_M_insert<double>(pNVar4->elev * dVar2);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>
                (((double)pNVar4[1].super_Element._vptr_Element - pNVar4->elev) * dVar2);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>
                (((double)pNVar4[1].super_Element.name._M_dataplus._M_p - pNVar4->elev) * dVar2);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>
                (((double)pNVar4[1].super_Element.name._M_string_length - pNVar4->elev) * dVar2);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>(dVar2 * *(double *)&pNVar4[1].super_Element.name.field_2);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      std::ostream::_M_insert<double>
                (*(double *)((long)&pNVar4[1].super_Element.name.field_2 + 8) *
                 (this->network->units).factors[2]);
      dVar2 = pNVar4[1].elev;
      if (dVar2 != 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,*(char **)((long)dVar2 + 8),*(long *)((long)dVar2 + 0x10));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n",1);
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeTanks()
{
    fout << "\n[TANKS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::TANK )
        {
            Tank* tank = static_cast<Tank*>(node);
            double ucfLength = network->ucf(Units::LENGTH);
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4) << node->elev * ucfLength;
            fout << setw(12) << (tank->initHead - node->elev) * ucfLength;
            fout << setw(12) << (tank->minHead - node->elev) * ucfLength;
            fout << setw(12) << (tank->maxHead - node->elev) * ucfLength;
            fout << setw(12) << tank->diameter * ucfLength;
            fout << setw(12) << tank->minVolume * network->ucf(Units::VOLUME);
            if ( tank->volCurve ) fout << tank->volCurve->name;
            fout << "\n";
        }
    }
}